

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# itm-solver-equalities-101.cpp
# Opt level: O0

bool __thiscall
baryonyx::itm::
solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>
::
compute_update_row<baryonyx::bit_array,std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
          (solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>
           *this,bit_array *x,
          reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
          *first,reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *last,float kappa,float delta,float theta)

{
  row_iterator prVar1;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *x_00;
  bool bVar2;
  __tuple_element_t<0UL,_tuple<row_value_*,_row_value_*>_> *pprVar3;
  __tuple_element_t<1UL,_tuple<row_value_*,_row_value_*>_> *pprVar4;
  pointer begin;
  pointer prVar5;
  type pbVar6;
  type args;
  type prVar7;
  bool local_f1;
  undefined1 auStack_b0 [7];
  bool pi_change;
  string_view local_a0;
  int local_8c;
  undefined1 auStack_88 [4];
  int i;
  int local_74;
  int iStack_70;
  int selected;
  rc_size sizes;
  tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*> it;
  int local_4c;
  undefined1 auStack_48 [4];
  int k;
  bool local_35;
  float local_34;
  float fStack_30;
  bool at_least_one_pi_changed;
  float theta_local;
  float delta_local;
  float kappa_local;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *last_local;
  reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
  *first_local;
  bit_array *x_local;
  solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>
  *this_local;
  
  local_35 = false;
  local_34 = theta;
  fStack_30 = delta;
  theta_local = kappa;
  _delta_local = last;
  last_local = first;
  first_local = (reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                 *)x;
  x_local = (bit_array *)this;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_48,"update-row {} {} {}\n")
  ;
  debug_logger<true>::log<float,float,float>
            ((debug_logger<true> *)this,_auStack_48,&theta_local,&stack0xffffffffffffffd0,&local_34)
  ;
  while( true ) {
    bVar2 = std::
            operator==<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                      (first,last);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      return (bool)(local_35 & 1);
    }
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
    ::reverse_iterator((reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                        *)&it.
                           super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                           .super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>,
                       first);
    local_4c = constraint<std::reverse_iterator<__gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>>>
                         ((reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
                           *)&it.
                              super__Tuple_impl<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                              .
                              super__Head_base<0UL,_baryonyx::sparse_matrix<int>::row_value_*,_false>
                         );
    if (*(int *)(this + 0x80) <= local_4c) break;
    sparse_matrix<int>::row((sparse_matrix<int> *)&sizes,(int)this + 0x10);
    pprVar3 = std::
              get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&sizes);
    prVar1 = *pprVar3;
    pprVar4 = std::
              get<1ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&sizes);
    solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>
    ::decrease_preference
              ((solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                *)this,prVar1,*pprVar4,local_34);
    pprVar3 = std::
              get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&sizes);
    prVar1 = *pprVar3;
    pprVar4 = std::
              get<1ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&sizes);
    _iStack_70 = solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                 ::compute_reduced_costs<baryonyx::bit_array>
                           ((solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                             *)this,prVar1,*pprVar4,(bit_array *)first_local);
    begin = std::
            unique_ptr<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
            ::get((unique_ptr<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
                   *)(this + 0x60));
    prVar5 = std::
             unique_ptr<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
             ::get((unique_ptr<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
                    *)(this + 0x60));
    calculator_sort<baryonyx::itm::maximize_tag,baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>::rc_data*>
              (begin,prVar5 + iStack_70,*(random_engine **)(this + 8));
    pbVar6 = std::
             unique_ptr<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[]>_>
                           *)(this + 0x68),(long)local_4c);
    local_74 = solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>
               ::select_variables((solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                                   *)this,(rc_size *)&stack0xffffffffffffff90,pbVar6->value);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_88,
               "constraints {}: {} = ");
    pbVar6 = std::
             unique_ptr<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::bound_factor[]>_>
                           *)(this + 0x68),(long)local_4c);
    debug_logger<true>::log<int,int>
              ((debug_logger<true> *)this,_auStack_88,&local_4c,&pbVar6->value);
    for (local_8c = 0; local_8c < iStack_70; local_8c = local_8c + 1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_a0,"{} ({}) ")
      ;
      args = std::
             unique_ptr<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
             ::operator[]((unique_ptr<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
                           *)(this + 0x60),(long)local_8c);
      prVar7 = std::
               unique_ptr<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
               ::operator[]((unique_ptr<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[],_std::default_delete<baryonyx::itm::solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>::rc_data[]>_>
                             *)(this + 0x60),(long)local_8c);
      debug_logger<true>::log<float,int>
                ((debug_logger<true> *)this,local_a0,&args->value,&prVar7->id);
    }
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)auStack_b0," => Selected: {}\n");
    debug_logger<true>::log<int>((debug_logger<true> *)this,_auStack_b0,&local_74);
    x_00 = first_local;
    pprVar3 = std::
              get<0ul,baryonyx::sparse_matrix<int>::row_value*,baryonyx::sparse_matrix<int>::row_value*>
                        ((tuple<baryonyx::sparse_matrix<int>::row_value_*,_baryonyx::sparse_matrix<int>::row_value_*>
                          *)&sizes);
    bVar2 = affect<baryonyx::itm::solver_equalities_101coeff<float,baryonyx::itm::maximize_tag,baryonyx::itm::default_cost_type<float>,true>,baryonyx::bit_array,baryonyx::sparse_matrix<int>::row_value*,float>
                      ((solver_equalities_101coeff<float,_baryonyx::itm::maximize_tag,_baryonyx::itm::default_cost_type<float>,_true>
                        *)this,(bit_array *)x_00,*pprVar3,local_4c,local_74,iStack_70,theta_local,
                       fStack_30);
    local_f1 = true;
    if ((local_35 & 1U) == 0) {
      local_f1 = bVar2;
    }
    local_35 = local_f1;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>_>
    ::operator++(first);
  }
  details::fail_fast("Precondition","k < m",
                     "/workspace/llm4binary/github/license_c_cmakelists/quesnel[P]baryonyx/lib/src/itm-solver-equalities-101.cpp"
                     ,"277");
}

Assistant:

bool compute_update_row(Xtype& x,
                            Iterator first,
                            Iterator last,
                            Float kappa,
                            Float delta,
                            Float theta)
    {
        auto at_least_one_pi_changed{ false };

        logger::log("update-row {} {} {}\n", kappa, delta, theta);

        for (; first != last; ++first) {
            auto k = constraint(first);

            bx_expects(k < m);

            const auto it = ap.row(k);
            decrease_preference(std::get<0>(it), std::get<1>(it), theta);

            const auto sizes =
              compute_reduced_costs(std::get<0>(it), std::get<1>(it), x);

            calculator_sort<Mode>(R.get(), R.get() + sizes.r_size, rng);
            int selected = select_variables(sizes, b[k].value);

            logger::log("constraints {}: {} = ", k, b[k].value);

            for (int i = 0; i < sizes.r_size; ++i)
                logger::log("{} ({}) ", R[i].value, R[i].id);

            logger::log(" => Selected: {}\n", selected);

            auto pi_change = affect(*this,
                                    x,
                                    std::get<0>(it),
                                    k,
                                    selected,
                                    sizes.r_size,
                                    kappa,
                                    delta);
            at_least_one_pi_changed = at_least_one_pi_changed || pi_change;
        }

        return at_least_one_pi_changed;
    }